

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_create_obj(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj_00;
  object *obj;
  object_kind *kind;
  char s [80];
  char prompt [80];
  wchar_t ind;
  command_conflict *cmd_local;
  
  wVar2 = cmd_get_arg_number((command *)cmd,"index",(int *)(prompt + 0x4c));
  if (wVar2 != L'\0') {
    memset(&kind,0,0x50);
    strnfmt(s + 0x48,0x50,"Create which object (0-%d)? ",(ulong)(z_info->k_max - 1));
    _Var1 = get_string(s + 0x48,(char *)&kind,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string((char *)&kind,(int *)(prompt + 0x4c));
    if (!_Var1) {
      return;
    }
    cmd_set_arg_number((command *)cmd,"index",prompt._76_4_);
  }
  if (((int)prompt._76_4_ < 0) || ((int)(uint)z_info->k_max <= (int)prompt._76_4_)) {
    msg("That\'s not a valid kind of object.");
  }
  else {
    obj_00 = wiz_create_object_from_kind(k_info + (int)prompt._76_4_);
    wiz_drop_object(obj_00);
  }
  return;
}

Assistant:

void do_cmd_wiz_create_obj(struct command *cmd)
{
	int ind;

	if (cmd_get_arg_number(cmd, "index", &ind) != CMD_OK) {
		char prompt[80];
		char s[80] = "";

		strnfmt(prompt, sizeof(prompt),
			"Create which object (0-%d)? ", z_info->k_max - 1);
		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &ind)) return;
		cmd_set_arg_number(cmd, "index", ind);
	}

	if (ind >= 0 && ind < z_info->k_max) {
		struct object_kind *kind = &k_info[ind];
		struct object *obj = wiz_create_object_from_kind(kind);

		wiz_drop_object(obj);
	} else {
		msg("That's not a valid kind of object.");
	}
}